

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-docs.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"autogen-main.md",&local_49);
  export_md(&local_28,LLAMA_EXAMPLE_MAIN);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"autogen-server.md",&local_49);
  export_md(&local_48,LLAMA_EXAMPLE_SERVER);
  std::__cxx11::string::~string((string *)&local_48);
  return 0;
}

Assistant:

int main(int, char **) {
    export_md("autogen-main.md", LLAMA_EXAMPLE_MAIN);
    export_md("autogen-server.md", LLAMA_EXAMPLE_SERVER);

    return 0;
}